

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  thread t2;
  thread t1;
  EventCount *local_18;
  EventCount eventCount;
  
  eventCount.val_.super___atomic_base<unsigned_long>._M_i =
       (atomic<unsigned_long>)(__atomic_base<unsigned_long>)0x0;
  t2._M_id._M_thread = (id)(id)&eventCount;
  std::thread::thread<void(&)(EventCount*),EventCount*,void>(&t1,waiter,(EventCount **)&t2);
  usleep(1);
  local_18 = &eventCount;
  std::thread::thread<void(&)(EventCount*),EventCount*,void>(&t2,notifier,&local_18);
  std::thread::join();
  std::thread::join();
  std::thread::~thread(&t2);
  std::thread::~thread(&t1);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    EventCount eventCount;

    std::thread t1(waiter, &eventCount);
    usleep(1);
    std::thread t2(notifier, &eventCount);

    t1.join();
    t2.join();

    return 0;
}